

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * CTcPrsOpUnary::eval_const_subscript(CTcPrsNode *lhs,CTcPrsNode *subscript)

{
  int iVar1;
  tc_constval_type_t tVar2;
  undefined4 extraout_var;
  CTcConstVal *pCVar3;
  undefined4 extraout_var_00;
  long *in_RSI;
  CTPNListBase *in_RDI;
  CTcPrsNode *c;
  CTcPrsNode *local_18;
  
  local_18 = (CTcPrsNode *)0x0;
  iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x2ac1a1);
  if ((iVar1 != 0) && (iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x2ac1b4), iVar1 != 0)) {
    iVar1 = (*(in_RDI->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[1])();
    tVar2 = CTcConstVal::get_type((CTcConstVal *)CONCAT44(extraout_var,iVar1));
    if (tVar2 != TC_CVT_SSTR) {
      if (tVar2 == TC_CVT_LIST) {
        pCVar3 = (CTcConstVal *)(**(code **)(*in_RSI + 8))();
        tVar2 = CTcConstVal::get_type(pCVar3);
        if (tVar2 == TC_CVT_INT) {
          iVar1 = (*(in_RDI->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[1])();
          CTcConstVal::get_val_list((CTcConstVal *)CONCAT44(extraout_var_00,iVar1));
          pCVar3 = (CTcConstVal *)(**(code **)(*in_RSI + 8))();
          iVar1 = (int)((ulong)in_RSI >> 0x20);
          CTcConstVal::get_val_int(pCVar3);
          local_18 = CTPNListBase::get_const_ele(in_RDI,iVar1);
        }
        else {
          CTcTokenizer::log_error(0x2b0f);
        }
      }
      else if ((((tVar2 != TC_CVT_OBJ) && (tVar2 != TC_CVT_FUNCPTR)) &&
               (tVar2 != TC_CVT_ANONFUNCPTR)) && (tVar2 != TC_CVT_FLOAT)) {
        CTcTokenizer::log_error(0x2bbe);
      }
    }
  }
  return local_18;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::eval_const_subscript(
    CTcPrsNode *lhs, CTcPrsNode *subscript)
{
    /* assume we won't be able to evaluate this as a constant */
    CTcPrsNode *c = 0;

    /* 
     *   if we're subscripting a constant list by a constant index value,
     *   we can evaluate a constant result 
     */
    if (lhs->is_const() && subscript->is_const())
    {
        /* check the type of value we're indexing */
        switch (lhs->get_const_val()->get_type())
        {
        case TC_CVT_LIST:
            /* 
             *   It's a constant list.  Lists can only be indexed by integer
             *   values. 
             */
            if (subscript->get_const_val()->get_type() == TC_CVT_INT)
            {
                /* 
                 *   it's an integer - index the constant list by the
                 *   constant subscript to get the element value, which
                 *   replaces the entire list-and-index expression
                 */
                c = lhs->get_const_val()->get_val_list()->get_const_ele(
                    subscript->get_const_val()->get_val_int());
            }
            else
            {
                /* a list index must be an integer */
                G_tok->log_error(TCERR_CONST_IDX_NOT_INT);
            }
            break;

        case TC_CVT_SSTR:
        case TC_CVT_OBJ:
        case TC_CVT_FUNCPTR:
        case TC_CVT_ANONFUNCPTR:
        case TC_CVT_FLOAT:
            /* 
             *   these types don't define indexing as a native operator, but
             *   it's possible for this to be meaningful at run-time via
             *   operator overloading; simply leave the constant expression
             *   unevaluated so that we generate code to perform the index
             *   operation at run-time 
             */
            break;
            
        default:
            /* other types definitely cannot be indexed */
            G_tok->log_error(TCERR_CONST_IDX_INV_TYPE);
            break;
        }
    }
    
    /* return the constant result, if any */
    return c;
}